

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
visitShortCircuitOp(AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                    *this,BinaryExpression *expr)

{
  DataFlowState *other;
  DataFlowState *pDVar1;
  DataFlowState *this_00;
  DataFlowState *this_01;
  type falseState;
  type trueState;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_288;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_260;
  DataFlowState local_238;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_198;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  visitCondition((ConstantValue *)&local_198,this,expr->left_);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_198);
  other = &this->stateWhenTrue;
  this_01 = &local_d0;
  DataFlowState::DataFlowState(this_01,other);
  DataFlowState::DataFlowState(&local_238,&this->stateWhenFalse);
  pDVar1 = this_01;
  if (expr->op == LogicalOr) {
    pDVar1 = &local_238;
  }
  this_00 = &local_170;
  DataFlowState::DataFlowState(this_00,pDVar1);
  setState(this,this_00);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_170,
             (EVP_PKEY_CTX *)this_00);
  visitCondition((ConstantValue *)&local_260,this,expr->right_);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_260);
  pDVar1 = &this->stateWhenFalse;
  if ((expr->op == LogicalAnd) || (pDVar1 = other, expr->op != LogicalOr)) {
    this_01 = &local_238;
  }
  DataFlowAnalysis::joinState((DataFlowAnalysis *)this,pDVar1,this_01);
  adjustConditionalState((ConstantValue *)&_Stack_288,this,&expr->super_Expression);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&_Stack_288);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_238,
             (EVP_PKEY_CTX *)this);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_d0,
             (EVP_PKEY_CTX *)this);
  return;
}

Assistant:

void visitShortCircuitOp(const BinaryExpression& expr) {
        // Visit the LHS -- after this the state is guaranteed to be split.
        visitCondition(expr.left());

        // The state when visiting the RHS depends on the operator;
        // for logical OR we know we won't visit the RHS unless the
        // LHS is false, so we can set the state to the false state.
        // The opposite is true for logical AND and implication.
        auto trueState = std::move(stateWhenTrue), falseState = std::move(stateWhenFalse);
        setState(expr.op == BinaryOperator::LogicalOr ? std::move(falseState)
                                                      : std::move(trueState));
        visitCondition(expr.right());

        // Join the states from the two branches. For example,
        // for logical OR, we only got here if the LHS was false
        // so we join the true state with the true state after visiting
        // the RHS, since either being true leads to the same outcome.
        if (expr.op == BinaryOperator::LogicalOr)
            (DERIVED).joinState(stateWhenTrue, trueState);
        else if (expr.op == BinaryOperator::LogicalAnd)
            (DERIVED).joinState(stateWhenFalse, falseState);
        else {
            // Reminder that logical implication (a -> b) is
            // equivalent to (!a || b)
            SLANG_ASSERT(expr.op == BinaryOperator::LogicalImplication);
            (DERIVED).joinState(stateWhenTrue, falseState);
        }

        // Allow the full binary operator to set a constant
        // state if the full expression is constant.
        adjustConditionalState(expr);
    }